

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_erkstep_io.c
# Opt level: O0

int ERKStepSetOrder(void *arkode_mem,int ord)

{
  int in_ESI;
  int retval;
  sunindextype Bliw;
  sunindextype Blrw;
  ARKodeERKStepMem step_mem;
  ARKodeMem ark_mem;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  int in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  void *in_stack_ffffffffffffffd8;
  long local_20;
  int local_4;
  
  local_4 = erkStep_AccessStepMem
                      (in_stack_ffffffffffffffd8,
                       (char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                       (ARKodeMem *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                       (ARKodeERKStepMem *)0xea4248);
  if (local_4 == 0) {
    if (in_ESI < 1) {
      *(undefined4 *)((long)in_stack_ffffffffffffffd8 + 0x10) = 4;
    }
    else {
      *(int *)((long)in_stack_ffffffffffffffd8 + 0x10) = in_ESI;
    }
    *(undefined4 *)((long)in_stack_ffffffffffffffd8 + 0x18) = 0;
    *(undefined4 *)((long)in_stack_ffffffffffffffd8 + 0x14) = 0;
    ARKodeButcherTable_Space
              (*(ARKodeButcherTable *)((long)in_stack_ffffffffffffffd8 + 0x20),
               (sunindextype *)&stack0xffffffffffffffd0,(sunindextype *)&stack0xffffffffffffffd4);
    ARKodeButcherTable_Free
              ((ARKodeButcherTable)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
    *(undefined8 *)((long)in_stack_ffffffffffffffd8 + 0x20) = 0;
    *(long *)(local_20 + 0x220) = *(long *)(local_20 + 0x220) - (long)in_stack_ffffffffffffffd0;
    *(long *)(local_20 + 0x218) = *(long *)(local_20 + 0x218) - (long)in_stack_ffffffffffffffd4;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int ERKStepSetOrder(void *arkode_mem, int ord)
{
  ARKodeMem ark_mem;
  ARKodeERKStepMem step_mem;
  sunindextype Blrw, Bliw;
  int retval;

  /* access ARKodeERKStepMem structure */
  retval = erkStep_AccessStepMem(arkode_mem, "ERKStepSetOrder",
                                 &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS) return(retval);

  /* set user-provided value, or default, depending on argument */
  if (ord <= 0) {
    step_mem->q = Q_DEFAULT;
  } else {
    step_mem->q = ord;
  }

  /* clear Butcher tables, since user is requesting a change in method
     or a reset to defaults.  Tables will be set in ARKInitialSetup. */
  step_mem->stages = 0;
  step_mem->p = 0;

  ARKodeButcherTable_Space(step_mem->B, &Bliw, &Blrw);
  ARKodeButcherTable_Free(step_mem->B);
  step_mem->B = NULL;
  ark_mem->liw -= Bliw;
  ark_mem->lrw -= Blrw;

  return(ARK_SUCCESS);
}